

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

void P_DoCrunch(AActor *thing,FChangePosition *cpos)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  PalEntry kind;
  PClassActor *type;
  AActor *pAVar4;
  DAngle angle;
  FSoundID local_60;
  FName local_5c;
  DAngle local_58;
  undefined8 local_50;
  DVector3 local_48;
  
  if (((thing != (AActor *)0x0) &&
      (iVar3 = (*(thing->super_DThinker).super_DObject._vptr_DObject[0x18])(),
      cpos != (FChangePosition *)0x0)) && ((char)iVar3 != '\0')) {
    cpos->nofit = true;
    if ((0 < cpos->crushchange) && (((byte)level.maptime & 3) == 0)) {
      local_5c.Index = 0x90;
      local_50 = 0;
      iVar3 = P_DamageMobj(thing,(AActor *)0x0,(AActor *)0x0,cpos->crushchange,&local_5c,0,angle);
      if (((thing->flags2).Value & 0x18000000) == 0) {
        if (((thing->flags).Value & 0x80000) == 0) {
          kind = AActor::GetBloodColor(thing);
          type = AActor::GetBloodType(thing,0);
          if (iVar3 < 1) {
            iVar3 = cpos->crushchange;
          }
          P_TraceBleed(iVar3,thing);
          if (type != (PClassActor *)0x0) {
            local_48.Z = thing->Height * 0.5 + (thing->__Pos).Z;
            local_48.X = (thing->__Pos).X;
            local_48.Y = (thing->__Pos).Y;
            pAVar4 = Spawn(type,&local_48,ALLOW_REPLACE);
            iVar3 = FRandom::Random2(&pr_crunch);
            (pAVar4->Vel).X = (double)iVar3 * 0.0625;
            iVar3 = FRandom::Random2(&pr_crunch);
            (pAVar4->Vel).Y = (double)iVar3 * 0.0625;
            if ((kind.field_0 != 0) && (((pAVar4->flags2).Value & 0x10000) == 0)) {
              pAVar4->Translation = (uint)kind.field_0 >> 0x18 | 0x80000;
            }
            if (1 < cl_bloodtype.Value) {
              pbVar1 = (byte *)((long)&(pAVar4->renderflags).Value + 1);
              *pbVar1 = *pbVar1 | 0x80;
            }
          }
          iVar3 = FRandom::operator()(&M_Random);
          if (0 < cl_bloodtype.Value) {
            local_58.Degrees = (double)(iVar3 + -0x80) * 1.40625;
            local_48.Z = thing->Height * 0.5 + (thing->__Pos).Z;
            local_48.X = (thing->__Pos).X;
            local_48.Y = (thing->__Pos).Y;
            P_DrawSplash2(0x20,&local_48,&local_58,2,(int)kind.field_0);
          }
        }
        iVar3 = (thing->CrushPainSound).super_FSoundID.ID;
        if ((iVar3 != 0) && (bVar2 = S_GetSoundPlayingInfo(thing,iVar3), !bVar2)) {
          local_60.ID = (thing->CrushPainSound).super_FSoundID.ID;
          S_Sound(thing,2,&local_60,1.0,1.0);
        }
      }
    }
  }
  return;
}

Assistant:

void P_DoCrunch(AActor *thing, FChangePosition *cpos)
{
	if (!(thing && thing->Grind(true) && cpos)) return;
	cpos->nofit = true;

	if ((cpos->crushchange > 0) && !(level.maptime & 3))
	{
		int newdam = P_DamageMobj(thing, NULL, NULL, cpos->crushchange, NAME_Crush);

		// spray blood in a random direction
		if (!(thing->flags2&(MF2_INVULNERABLE | MF2_DORMANT)))
		{
			if (!(thing->flags&MF_NOBLOOD))
			{
				PalEntry bloodcolor = thing->GetBloodColor();
				PClassActor *bloodcls = thing->GetBloodType();
				
				P_TraceBleed (newdam > 0 ? newdam : cpos->crushchange, thing);
				if (bloodcls != NULL)
				{
					AActor *mo;

					mo = Spawn(bloodcls, thing->PosPlusZ(thing->Height / 2), ALLOW_REPLACE);

					mo->Vel.X = pr_crunch.Random2() / 16.;
					mo->Vel.Y = pr_crunch.Random2() / 16.;
					if (bloodcolor != 0 && !(mo->flags2 & MF2_DONTTRANSLATE))
					{
						mo->Translation = TRANSLATION(TRANSLATION_Blood, bloodcolor.a);
					}

					if (!(cl_bloodtype <= 1)) mo->renderflags |= RF_INVISIBLE;
				}

				DAngle an = (M_Random() - 128) * (360./256);
				if (cl_bloodtype >= 1)
				{
					P_DrawSplash2(32,  thing->PosPlusZ(thing->Height/2), an, 2, bloodcolor);
				}
			}
			if (thing->CrushPainSound != 0 && !S_GetSoundPlayingInfo(thing, thing->CrushPainSound))
			{
				S_Sound(thing, CHAN_VOICE, thing->CrushPainSound, 1.f, ATTN_NORM);
			}
		}
	}

	// keep checking (crush other things)
	return;
}